

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O2

uint Gli_ManSimulateSeqNode(Gli_Man_t *p,Gli_Obj_t *pNode)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint auStack_28 [4];
  uint pSimInfos [6];
  
  uVar5 = (ulong)(*(uint *)pNode >> 4 & 7);
  for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
    auStack_28[uVar2] =
         *(uint *)((long)pNode + (long)*(int *)(&pNode->field_0x1c + uVar2 * 4) * -4 + 0x10);
  }
  uVar1 = 0;
  for (iVar3 = 0; iVar3 != 0x20; iVar3 = iVar3 + 1) {
    uVar6 = 1 << ((byte)iVar3 & 0x1f);
    uVar7 = 0;
    for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      uVar4 = 1 << ((byte)uVar2 & 0x1f);
      if ((auStack_28[uVar2] & uVar6) == 0) {
        uVar4 = 0;
      }
      uVar7 = uVar7 | uVar4;
    }
    if ((*(uint *)((long)pNode->pTruth + (long)((int)uVar7 >> 5) * 4) >> (uVar7 & 0x1f) & 1) == 0) {
      uVar6 = 0;
    }
    uVar1 = uVar1 | uVar6;
  }
  return uVar1;
}

Assistant:

unsigned Gli_ManSimulateSeqNode( Gli_Man_t * p, Gli_Obj_t * pNode )
{
    unsigned pSimInfos[6], Result = 0;
    int nFanins = Gli_ObjFaninNum(pNode);
    int i, k, Phase;
    Gli_Obj_t * pFanin;
    assert( nFanins <= 16 );
    Gli_ObjForEachFanin( pNode, pFanin, i )
        pSimInfos[i] = pFanin->uSimInfo;
    for ( i = 0; i < 32; i++ )
    {
        Phase = 0;
        for ( k = 0; k < nFanins; k++ )
            if ( (pSimInfos[k] >> i) & 1 )
                Phase |= (1 << k);
        if ( Abc_InfoHasBit( (unsigned *)pNode->pTruth, Phase ) )
            Result |= (1 << i);
    }
    return Result;
}